

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O2

xmlChar * xmlC11NNormalizeString(xmlChar *input,xmlC14NNormalizationMode mode)

{
  xmlChar *pxVar1;
  xmlChar *pxVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  xmlChar xVar6;
  xmlChar *pxVar7;
  
  if ((input != (xmlChar *)0x0) &&
     (pxVar1 = (xmlChar *)(*xmlMalloc)(1000), pxVar1 != (xmlChar *)0x0)) {
    uVar3 = 1000;
    pxVar7 = pxVar1;
    while( true ) {
      xVar6 = *input;
      if (xVar6 == '\0') {
        *pxVar1 = '\0';
        return pxVar7;
      }
      pxVar2 = pxVar7;
      if ((long)(int)(uVar3 - 10) < (long)pxVar1 - (long)pxVar7) break;
LAB_0015a67e:
      if (xVar6 == '<') {
        if ((mode == XMLC14N_NORMALIZE_TEXT) || (mode == XMLC14N_NORMALIZE_ATTR)) {
          builtin_memcpy(pxVar1,"&lt;",4);
LAB_0015a6b2:
          pxVar1 = pxVar1 + 4;
        }
        else {
LAB_0015a751:
          *pxVar1 = xVar6;
          pxVar1 = pxVar1 + 1;
        }
      }
      else {
        if (xVar6 == '>' && mode == XMLC14N_NORMALIZE_TEXT) {
          builtin_memcpy(pxVar1,"&gt;",4);
          goto LAB_0015a6b2;
        }
        if (xVar6 == '&') {
          if ((mode != XMLC14N_NORMALIZE_TEXT) && (mode != XMLC14N_NORMALIZE_ATTR))
          goto LAB_0015a751;
          builtin_memcpy(pxVar1,"&amp",4);
        }
        else {
          if (xVar6 == '\"' && mode == XMLC14N_NORMALIZE_ATTR) {
            builtin_memcpy(pxVar1,"&quot;",6);
            pxVar1 = pxVar1 + 6;
            goto LAB_0015a757;
          }
          if (xVar6 == '\t' && mode == XMLC14N_NORMALIZE_ATTR) {
            builtin_memcpy(pxVar1,"&#x9",4);
          }
          else if (xVar6 == '\n' && mode == XMLC14N_NORMALIZE_ATTR) {
            builtin_memcpy(pxVar1,"&#xA",4);
          }
          else {
            if (xVar6 != '\r' || XMLC14N_NORMALIZE_TEXT < mode) goto LAB_0015a751;
            builtin_memcpy(pxVar1,"&#xD",4);
          }
        }
        pxVar1[4] = ';';
        pxVar1 = pxVar1 + 5;
      }
LAB_0015a757:
      input = input + 1;
      pxVar7 = pxVar2;
    }
    uVar5 = 1;
    if ((int)uVar3 < 1) {
LAB_0015a656:
      pxVar2 = (xmlChar *)(*xmlRealloc)(pxVar7,(size_t)uVar5);
      if (pxVar2 != (xmlChar *)0x0) {
        pxVar1 = pxVar2 + (int)((long)pxVar1 - (long)pxVar7);
        xVar6 = *input;
        uVar3 = uVar5;
        goto LAB_0015a67e;
      }
    }
    else if (uVar3 < 1000000000) {
      uVar4 = uVar3 + 1 >> 1;
      uVar5 = uVar4 + uVar3;
      if (1000000000 - uVar4 < uVar3) {
        uVar5 = 1000000000;
      }
      goto LAB_0015a656;
    }
    (*xmlFree)(pxVar7);
  }
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlC11NNormalizeString(const xmlChar * input,
                       xmlC14NNormalizationMode mode)
{
    const xmlChar *cur = input;
    xmlChar *buffer = NULL;
    xmlChar *out = NULL;
    int buffer_size = 0;

    if (input == NULL)
        return (NULL);

    /*
     * allocate an translation buffer.
     */
    buffer_size = 1000;
    buffer = xmlMalloc(buffer_size);
    if (buffer == NULL)
        return (NULL);
    out = buffer;

    while (*cur != '\0') {
        if ((out - buffer) > (buffer_size - 10)) {
            xmlChar *tmp;
            int indx = out - buffer;
            int newSize;

            newSize = xmlGrowCapacity(buffer_size, 1, 1, XML_MAX_ITEMS);
            if (newSize < 0) {
                xmlFree(buffer);
                return(NULL);
            }
            tmp = xmlRealloc(buffer, newSize);
            if (tmp == NULL) {
                xmlFree(buffer);
                return(NULL);
            }
            buffer = tmp;
            buffer_size = newSize;
            out = &buffer[indx];
        }

        if ((*cur == '<') && ((mode == XMLC14N_NORMALIZE_ATTR) ||
                              (mode == XMLC14N_NORMALIZE_TEXT))) {
            *out++ = '&';
            *out++ = 'l';
            *out++ = 't';
            *out++ = ';';
        } else if ((*cur == '>') && (mode == XMLC14N_NORMALIZE_TEXT)) {
            *out++ = '&';
            *out++ = 'g';
            *out++ = 't';
            *out++ = ';';
        } else if ((*cur == '&') && ((mode == XMLC14N_NORMALIZE_ATTR) ||
                                     (mode == XMLC14N_NORMALIZE_TEXT))) {
            *out++ = '&';
            *out++ = 'a';
            *out++ = 'm';
            *out++ = 'p';
            *out++ = ';';
        } else if ((*cur == '"') && (mode == XMLC14N_NORMALIZE_ATTR)) {
            *out++ = '&';
            *out++ = 'q';
            *out++ = 'u';
            *out++ = 'o';
            *out++ = 't';
            *out++ = ';';
        } else if ((*cur == '\x09') && (mode == XMLC14N_NORMALIZE_ATTR)) {
            *out++ = '&';
            *out++ = '#';
            *out++ = 'x';
            *out++ = '9';
            *out++ = ';';
        } else if ((*cur == '\x0A') && (mode == XMLC14N_NORMALIZE_ATTR)) {
            *out++ = '&';
            *out++ = '#';
            *out++ = 'x';
            *out++ = 'A';
            *out++ = ';';
        } else if ((*cur == '\x0D') && ((mode == XMLC14N_NORMALIZE_ATTR) ||
                                        (mode == XMLC14N_NORMALIZE_TEXT) ||
                                        (mode == XMLC14N_NORMALIZE_COMMENT) ||
					(mode == XMLC14N_NORMALIZE_PI))) {
            *out++ = '&';
            *out++ = '#';
            *out++ = 'x';
            *out++ = 'D';
            *out++ = ';';
        } else {
            /*
             * Works because on UTF-8, all extended sequences cannot
             * result in bytes in the ASCII range.
             */
            *out++ = *cur;
        }
        cur++;
    }
    *out = 0;
    return (buffer);
}